

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::AddAlternateTemplateRootDirectoryHelper
          (TemplateCache *this,string *directory,bool clear_template_search_path)

{
  bool bVar1;
  Mutex *pMVar2;
  bool bVar3;
  char *__buf;
  char *pcVar4;
  ostream *poVar5;
  int *piVar6;
  string normalized;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  pMVar2 = this->mutex_;
  Mutex::ReaderLock(pMVar2);
  bVar1 = this->is_frozen_;
  Mutex::ReaderUnlock(pMVar2);
  if (bVar1 == false) {
    std::__cxx11::string::string((string *)&local_88,(string *)directory);
    NormalizeDirectory(&local_88);
    bVar3 = IsAbspath(&local_88);
    if (!bVar3) {
      __buf = (char *)operator_new__(0x1000);
      pcVar4 = getcwd(__buf,0x1000);
      if (pcVar4 == (char *)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"WARNING: [");
        piVar6 = __errno_location();
        pcVar4 = strerror(*piVar6);
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,"] ");
        poVar5 = std::operator<<(poVar5,"Unable to convert \'");
        poVar5 = std::operator<<(poVar5,(string *)&local_88);
        poVar5 = std::operator<<(poVar5,"\' to an absolute path, with cwd=");
        std::operator<<(poVar5,__buf);
      }
      else {
        std::__cxx11::string::string((string *)&local_68,pcVar4,&local_89);
        PathJoin(&local_48,&local_68,&local_88);
        std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
      }
      operator_delete__(__buf);
    }
    pMVar2 = this->search_path_mutex_;
    Mutex::Lock(pMVar2);
    if (clear_template_search_path) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->search_path_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->search_path_,&local_88);
    Mutex::Unlock(pMVar2);
    ReloadAllIfChanged(this,LAZY_RELOAD);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool TemplateCache::AddAlternateTemplateRootDirectoryHelper(
    const string& directory,
    bool clear_template_search_path) {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // Cannot set root-directory on a frozen cache.
      return false;
    }
  }
  string normalized = directory;
  // make sure it ends with '/'
  NormalizeDirectory(&normalized);
  // Make the directory absolute if it isn't already.  This makes code
  // safer if client later does a chdir.
  if (!IsAbspath(normalized)) {
    char* cwdbuf = new char[PATH_MAX];   // new to avoid stack overflow
    const char* cwd = getcwd(cwdbuf, PATH_MAX);
    if (!cwd) {   // probably not possible, but best to be defensive
      PLOG(WARNING) << "Unable to convert '" << normalized
                    << "' to an absolute path, with cwd=" << cwdbuf;
    } else {
      normalized = PathJoin(cwd, normalized);
    }
    delete[] cwdbuf;
  }

  VLOG(2) << "Setting Template directory to " << normalized << endl;
  {
    WriterMutexLock ml(search_path_mutex_);
    if (clear_template_search_path) {
      search_path_.clear();
    }
    search_path_.push_back(normalized);
  }

  // NOTE(williasr): The template root is not part of the template
  // cache key, so we need to invalidate the cache contents.
  ReloadAllIfChanged(LAZY_RELOAD);
  return true;
}